

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerSettings.cpp
# Opt level: O0

void __thiscall OneWireAnalyzerSettings::LoadSettings(OneWireAnalyzerSettings *this,char *settings)

{
  int iVar1;
  char *local_38;
  char *name_string;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  OneWireAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&local_38);
  iVar1 = strcmp(local_38,"SaleaeOneWireAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeOneWireAnalyzer: Provided with a settings string that doesn\'t belong to us;")
    ;
  }
  SimpleArchive::operator>>(local_20,&this->mOneWireChannel);
  SimpleArchive::operator>>(local_20,&this->mOverdrive);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mOneWireChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void OneWireAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeOneWireAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeOneWireAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mOneWireChannel;
    text_archive >> mOverdrive;

    ClearChannels();
    AddChannel( mOneWireChannel, "1-WIRE", true );

    UpdateInterfacesFromSettings();
}